

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O1

void button_state_destroy(natwm_state *state)

{
  toggle_modifiers *ptVar1;
  
  ptVar1 = state->button_state->modifiers;
  if (ptVar1 != (toggle_modifiers *)0x0) {
    free(ptVar1->masks);
    free(state->button_state->modifiers);
  }
  if (state->button_state->resize_helper != 0) {
    xcb_unmap_window(state->xcb);
  }
  free(state->button_state);
  return;
}

Assistant:

void button_state_destroy(struct natwm_state *state)
{
        if (state->button_state->modifiers != NULL) {
                free(state->button_state->modifiers->masks);
                free(state->button_state->modifiers);
        }

        if (state->button_state->resize_helper != XCB_NONE) {
                xcb_unmap_window(state->xcb, state->button_state->resize_helper);
        }

        free(state->button_state);
}